

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

string * __thiscall
Fossilize::encode_base64_abi_cxx11_
          (string *__return_storage_ptr__,Fossilize *this,void *data_,size_t size)

{
  unsigned_long *puVar1;
  char cVar2;
  unsigned_long local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  unsigned_long outbytes;
  char c3;
  char c2;
  char c1;
  char c0;
  uint32_t code;
  size_t i;
  long local_30;
  size_t num_chars;
  uint8_t *data;
  size_t size_local;
  void *data__local;
  string *ret;
  
  local_30 = ((long)data_ + 2U) / 3 << 2;
  i._7_1_ = 0;
  num_chars = (size_t)this;
  data = (uint8_t *)data_;
  size_local = (size_t)this;
  data__local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (_c3 = (uint8_t *)0x0; _c3 < data; _c3 = _c3 + 3) {
    outbytes._4_4_ = (uint)_c3[num_chars] << 0x10;
    if (_c3 + 1 < data) {
      outbytes._4_4_ = (uint)_c3[num_chars + 1] << 8 | outbytes._4_4_;
    }
    if (_c3 + 2 < data) {
      outbytes._4_4_ = _c3[num_chars + 2] | outbytes._4_4_;
    }
    outbytes._3_1_ = base64(outbytes._4_4_ >> 0x12);
    outbytes._2_1_ = base64(outbytes._4_4_ >> 0xc & 0x3f);
    outbytes._1_1_ = base64(outbytes._4_4_ >> 6 & 0x3f);
    outbytes._0_1_ = base64(outbytes._4_4_ & 0x3f);
    local_58 = (long)data - (long)_c3;
    local_60 = 3;
    puVar1 = std::min<unsigned_long>(&local_58,&local_60);
    local_50 = *puVar1;
    if (local_50 == 1) {
      outbytes._1_1_ = '=';
      outbytes._0_1_ = '=';
    }
    else if (local_50 == 2) {
      outbytes._0_1_ = '=';
    }
    cVar2 = (char)__return_storage_ptr__;
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
    std::__cxx11::string::push_back(cVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string encode_base64(const void *data_, size_t size)
{
	auto *data = static_cast<const uint8_t *>(data_);
	size_t num_chars = 4 * ((size + 2) / 3);
	std::string ret;
	ret.reserve(num_chars);

	for (size_t i = 0; i < size; i += 3)
	{
		uint32_t code = data[i] << 16;
		if (i + 1 < size)
			code |= data[i + 1] << 8;
		if (i + 2 < size)
			code |= data[i + 2] << 0;

		auto c0 = base64((code >> 18) & 63);
		auto c1 = base64((code >> 12) & 63);
		auto c2 = base64((code >>  6) & 63);
		auto c3 = base64((code >>  0) & 63);

		auto outbytes = std::min(size - i, size_t(3));
		if (outbytes == 1)
		{
			c2 = '=';
			c3 = '=';
		}
		else if (outbytes == 2)
			c3 = '=';

		ret.push_back(c0);
		ret.push_back(c1);
		ret.push_back(c2);
		ret.push_back(c3);
	}

	return ret;
}